

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_address_CfdGetDescriptorChecksum_Test::TestBody
          (cfdcapi_address_CfdGetDescriptorChecksum_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__1;
  char **in_stack_000001b0;
  char *in_stack_000001b8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  char *output_descriptor;
  string checksum;
  string descriptor;
  bool *in_stack_fffffffffffffd18;
  AssertionResult *in_stack_fffffffffffffd20;
  undefined6 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  char *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  AssertHelper local_278;
  Message local_270;
  string local_268 [32];
  AssertionResult local_248;
  string local_238;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_201;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  string local_1b8 [32];
  AssertionResult local_198;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_151;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  string local_108 [32];
  AssertionResult local_e8;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a1;
  AssertionResult local_a0;
  AssertHelper local_90;
  Message local_88;
  undefined4 local_7c;
  AssertionResult local_78 [2];
  int local_54;
  char *local_50;
  string local_48 [32];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  std::__cxx11::string::string(local_48);
  local_50 = (char *)0x0;
  std::__cxx11::string::operator=
            (local_28,"wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)");
  std::__cxx11::string::c_str();
  local_54 = CfdGetDescriptorChecksum
                       (gtest_ar_2.message_.ptr_,gtest_ar_2._4_4_,in_stack_000001b8,
                        in_stack_000001b0);
  local_7c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30,
             (CfdErrorCode *)
             CONCAT17(in_stack_fffffffffffffd2f,
                      CONCAT16(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd28)),
             (int *)in_stack_fffffffffffffd20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30a5c7);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x209,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x30a624);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30a679);
  local_a1 = local_50 != (char *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(type *)0x30a6a5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_a0,(AssertionResult *)"(NULL == output_descriptor)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x20a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message((Message *)0x30a79d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30a818);
  if (local_54 == 0) {
    std::__cxx11::string::operator=(local_48,"#8zl0zxma");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd4f,
                            CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   in_stack_fffffffffffffd40);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e8,"(descriptor + checksum).c_str()","output_descriptor",pcVar4,
               local_50);
    std::__cxx11::string::~string(local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30a92d);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x20d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x30a98a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30a9df);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffd2f,
                                         CONCAT16(in_stack_fffffffffffffd2e,
                                                  in_stack_fffffffffffffd28)));
    local_50 = (char *)0x0;
  }
  std::__cxx11::string::operator=(local_28,"addr(bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4)");
  std::__cxx11::string::c_str();
  local_54 = CfdGetDescriptorChecksum
                       (gtest_ar_2.message_.ptr_,gtest_ar_2._4_4_,in_stack_000001b8,
                        in_stack_000001b0);
  local_12c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30,
             (CfdErrorCode *)
             CONCAT17(in_stack_fffffffffffffd2f,
                      CONCAT16(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd28)),
             (int *)in_stack_fffffffffffffd20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30aae5);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x215,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x30ab42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ab97);
  local_151 = local_50 != (char *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(type *)0x30abc3);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&local_150,(AssertionResult *)"(NULL == output_descriptor)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x216,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message((Message *)0x30acbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ad36);
  if (local_54 == 0) {
    std::__cxx11::string::operator=(local_48,"#uyjndxcw");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   in_stack_fffffffffffffd40);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_198,"(descriptor + checksum).c_str()","output_descriptor",pcVar4,
               local_50);
    std::__cxx11::string::~string(local_1b8);
    in_stack_fffffffffffffd4e = testing::AssertionResult::operator_cast_to_bool(&local_198);
    if (!(bool)in_stack_fffffffffffffd4e) {
      testing::Message::Message(&local_1c0);
      in_stack_fffffffffffffd40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x30ae4b);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x219,(char *)in_stack_fffffffffffffd40);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x30aea8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30aefd);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffd2f,
                                         CONCAT16(in_stack_fffffffffffffd2e,
                                                  in_stack_fffffffffffffd28)));
    local_50 = (char *)0x0;
  }
  std::__cxx11::string::operator=(local_28,"addr(ert1q57etrknhl75e64jmqrvl0vwzu39xjpagaw9ynw)");
  std::__cxx11::string::c_str();
  local_54 = CfdGetDescriptorChecksum
                       (gtest_ar_2.message_.ptr_,gtest_ar_2._4_4_,in_stack_000001b8,
                        in_stack_000001b0);
  local_1dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(local_54,in_stack_fffffffffffffd38),in_stack_fffffffffffffd30,
             (CfdErrorCode *)
             CONCAT17(in_stack_fffffffffffffd2f,
                      CONCAT16(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd28)),
             (int *)in_stack_fffffffffffffd20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30b008);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x222,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x30b065);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b0ba);
  local_201 = local_50 != (char *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(type *)0x30b0e6);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_238,(internal *)&local_200,(AssertionResult *)"(NULL == output_descriptor)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x223,pcVar4);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    testing::Message::~Message((Message *)0x30b1de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b259);
  if (local_54 == 0) {
    std::__cxx11::string::operator=(local_48,"#87kymh3n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   in_stack_fffffffffffffd40);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_248,"(descriptor + checksum).c_str()","output_descriptor",pcVar4,
               local_50);
    std::__cxx11::string::~string(local_268);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_270);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30b36b);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x226,pcVar4);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message((Message *)0x30b3b9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b408);
    CfdFreeStringBuffer((char *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffd28)));
    local_50 = (char *)0x0;
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(cfdcapi_address, CfdGetDescriptorChecksum) {
  std::string descriptor;
  std::string checksum;
  char* output_descriptor = nullptr;
  int ret;

  descriptor = "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)";
  ret = CfdGetDescriptorChecksum(nullptr, kCfdNetworkMainnet,
      descriptor.c_str(), &output_descriptor);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == output_descriptor));
  if (kCfdSuccess == ret) {
    checksum = "#8zl0zxma";
    EXPECT_STREQ((descriptor + checksum).c_str(), output_descriptor);
    CfdFreeStringBuffer(output_descriptor);
    output_descriptor = nullptr;
  }

  descriptor = "addr(bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4)";
  ret = CfdGetDescriptorChecksum(nullptr, kCfdNetworkMainnet,
      descriptor.c_str(), &output_descriptor);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == output_descriptor));
  if (kCfdSuccess == ret) {
    checksum = "#uyjndxcw";
    EXPECT_STREQ((descriptor + checksum).c_str(), output_descriptor);
    CfdFreeStringBuffer(output_descriptor);
    output_descriptor = nullptr;
  }

#ifndef CFD_DISABLE_ELEMENTS
  descriptor = "addr(ert1q57etrknhl75e64jmqrvl0vwzu39xjpagaw9ynw)";
  ret = CfdGetDescriptorChecksum(nullptr, kCfdNetworkElementsRegtest,
      descriptor.c_str(), &output_descriptor);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == output_descriptor));
  if (kCfdSuccess == ret) {
    checksum = "#87kymh3n";
    EXPECT_STREQ((descriptor + checksum).c_str(), output_descriptor);
    CfdFreeStringBuffer(output_descriptor);
    output_descriptor = nullptr;
  }
#endif  // CFD_DISABLE_ELEMENTS
}